

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_entry_lite.h
# Opt level: O2

char * __thiscall
google::protobuf::internal::
MapEntryImpl<CoreML::Specification::Metadata_UserDefinedEntry_DoNotUse,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9>
::_InternalParse(MapEntryImpl<CoreML::Specification::Metadata_UserDefinedEntry_DoNotUse,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9>
                 *this,char *ptr,ParseContext *ctx)

{
  bool bVar1;
  ValueMapEntryAccessorType *value;
  KeyMapEntryAccessorType *value_00;
  uint32_t tag;
  char *local_38;
  uint local_2c;
  
  local_38 = ptr;
  do {
    bVar1 = ParseContext::Done(ctx,&local_38);
    if (bVar1) {
      return local_38;
    }
    local_38 = ReadTag(local_38,&local_2c,0);
    if (local_38 == (char *)0x0) {
      return (char *)0x0;
    }
    if (local_2c == 10) {
      *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 1;
      value_00 = mutable_key(this);
      local_38 = MapTypeHandler<(google::protobuf::internal::WireFormatLite::FieldType)9,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::Read(local_38,ctx,value_00);
      bVar1 = CoreML::Specification::Metadata_UserDefinedEntry_DoNotUse::ValidateKey(value_00);
LAB_001ce427:
      if (bVar1 == false) {
        return (char *)0x0;
      }
    }
    else {
      if (local_2c == 0x12) {
        *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 2;
        value = mutable_value(this);
        local_38 = MapTypeHandler<(google::protobuf::internal::WireFormatLite::FieldType)9,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::Read(local_38,ctx,value);
        bVar1 = CoreML::Specification::Metadata_UserDefinedEntry_DoNotUse::ValidateValue(value);
        goto LAB_001ce427;
      }
      if ((local_2c == 0) || ((local_2c & 7) == 4)) {
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = local_2c - 1;
        return local_38;
      }
      local_38 = UnknownFieldParse(local_2c,(string *)0x0,local_38,ctx);
    }
    if (local_38 == (char *)0x0) {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

const char* _InternalParse(const char* ptr, ParseContext* ctx) final {
    while (!ctx->Done(&ptr)) {
      uint32_t tag;
      ptr = ReadTag(ptr, &tag);
      GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
      if (tag == kKeyTag) {
        set_has_key();
        KeyMapEntryAccessorType* key = mutable_key();
        ptr = KeyTypeHandler::Read(ptr, ctx, key);
        if (!Derived::ValidateKey(key)) return nullptr;
      } else if (tag == kValueTag) {
        set_has_value();
        ValueMapEntryAccessorType* value = mutable_value();
        ptr = ValueTypeHandler::Read(ptr, ctx, value);
        if (!Derived::ValidateValue(value)) return nullptr;
      } else {
        if (tag == 0 || WireFormatLite::GetTagWireType(tag) ==
                            WireFormatLite::WIRETYPE_END_GROUP) {
          ctx->SetLastTag(tag);
          return ptr;
        }
        ptr = UnknownFieldParse(tag, static_cast<std::string*>(nullptr), ptr,
                                ctx);
      }
      GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
    }
    return ptr;
  }